

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFPageDocumentHelper::flattenAnnotations
          (QPDFPageDocumentHelper *this,int required_flags,int forbidden_flags)

{
  string *this_00;
  bool bVar1;
  _Alloc_hider page;
  allocator<char> local_e1;
  QPDFPageDocumentHelper *local_e0;
  QPDFObjectHandle resources;
  string local_c0;
  undefined1 local_a0 [16];
  string local_90;
  undefined1 local_70 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  QPDFAcroFormDocumentHelper afdh;
  
  local_e0 = this;
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            (&afdh,(this->super_QPDFDocumentHelper).qpdf);
  bVar1 = QPDFAcroFormDocumentHelper::getNeedAppearances(&afdh);
  if (bVar1) {
    QPDF::getRoot((QPDF *)local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a0 + 0x10),"/AcroForm",(allocator<char> *)local_70);
    QPDFObjectHandle::getKey(&resources,(string *)local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "document does not have updated appearance streams, so form fields will not be flattened"
               ,(allocator<char> *)(local_70 + 0x10));
    QPDFObjectHandle::warnIfPossible(&resources,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&resources.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)(local_a0 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  }
  getAllPages((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_c0,
              local_e0);
  this_00 = (string *)(local_a0 + 0x10);
  for (page._M_p = local_c0._M_dataplus._M_p; page._M_p != (pointer)local_c0._M_string_length;
      page._M_p = page._M_p + 0x38) {
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"/Resources",(allocator<char> *)local_a0);
    QPDFPageObjectHelper::getAttribute
              ((QPDFPageObjectHelper *)&resources,(string *)page._M_p,SUB81(this_00,0));
    std::__cxx11::string::~string(this_00);
    bVar1 = QPDFObjectHandle::isDictionary(&resources);
    if (!bVar1) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_70,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(((QPDFPageObjectHelper *)page._M_p)->super_QPDFObjectHelper).super_BaseHandle);
      std::__cxx11::string::string<std::allocator<char>>(this_00,"/Resources",&local_e1);
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)local_a0,(string *)local_70,(QPDFObjectHandle *)this_00);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      std::__cxx11::string::~string(this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    }
    flattenAnnotationsForPage
              (local_e0,(QPDFPageObjectHelper *)page._M_p,&resources,&afdh,required_flags,
               forbidden_flags);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&resources.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_c0);
  bVar1 = QPDFAcroFormDocumentHelper::getNeedAppearances(&afdh);
  if (!bVar1) {
    QPDF::getRoot((QPDF *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a0 + 0x10),"/AcroForm",(allocator<char> *)&resources);
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_c0,(string *)(local_a0 + 0x10));
    std::__cxx11::string::~string((string *)(local_a0 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&afdh);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotations(int required_flags, int forbidden_flags)
{
    QPDFAcroFormDocumentHelper afdh(this->qpdf);
    if (afdh.getNeedAppearances()) {
        this->qpdf.getRoot()
            .getKey("/AcroForm")
            .warnIfPossible(
                "document does not have updated appearance streams, so form fields "
                "will not be flattened");
    }
    for (auto& ph: getAllPages()) {
        QPDFObjectHandle resources = ph.getAttribute("/Resources", true);
        if (!resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper flatten resources missing or invalid");
            resources = ph.getObjectHandle().replaceKeyAndGetNew(
                "/Resources", QPDFObjectHandle::newDictionary());
        }
        flattenAnnotationsForPage(ph, resources, afdh, required_flags, forbidden_flags);
    }
    if (!afdh.getNeedAppearances()) {
        this->qpdf.getRoot().removeKey("/AcroForm");
    }
}